

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  buffer<char> *pbVar1;
  char *pcVar2;
  size_t sVar3;
  buffer<char> *buf;
  
  pbVar1 = (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if (pbVar1->capacity_ < pbVar1->size_ + 1) {
    (**pbVar1->_vptr_buffer)(pbVar1);
  }
  if (pbVar1->capacity_ < pbVar1->size_ + 1) {
    (**pbVar1->_vptr_buffer)(pbVar1);
  }
  pcVar2 = pbVar1->ptr_;
  sVar3 = pbVar1->size_;
  pbVar1->size_ = sVar3 + 1;
  pcVar2[sVar3] = (char)__fd;
  return (ssize_t)pcVar2;
}

Assistant:

void write(char value) {
    auto&& it = reserve(1);
    *it++ = value;
  }